

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall SQLite::Database::Deleter::operator()(Deleter *this,sqlite3 *apSQLite)

{
  int iVar1;
  int ret;
  sqlite3 *apSQLite_local;
  Deleter *this_local;
  
  iVar1 = sqlite3_close(apSQLite);
  if (iVar1 != 0) {
    __assert_fail("0 == ret && \"database is locked\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tripplet[P]vbus-server/SQLiteCpp/src/Database.cpp"
                  ,0x5c,"void SQLite::Database::Deleter::operator()(sqlite3 *)");
  }
  return;
}

Assistant:

void Database::Deleter::operator()(sqlite3* apSQLite)
{
    const int ret = sqlite3_close(apSQLite); // Calling sqlite3_close() with a nullptr argument is a harmless no-op.

    // Avoid unreferenced variable warning when build in release mode
    (void) ret;

    // Only case of error is SQLITE_BUSY: "database is locked" (some statements are not finalized)
    // Never throw an exception in a destructor :
    SQLITECPP_ASSERT(SQLITE_OK == ret, "database is locked");  // See SQLITECPP_ENABLE_ASSERT_HANDLER
}